

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_sleep_cancel(nng_aio *aio,void *arg,int rv)

{
  nni_aio_expire_q *mtx;
  nni_aio_expire_q *eq;
  int rv_local;
  void *arg_local;
  nng_aio *aio_local;
  
  mtx = aio->a_expire_q;
  nni_mtx_lock(&mtx->eq_mtx);
  if ((aio->a_sleep & 1U) == 0) {
    nni_mtx_unlock(&mtx->eq_mtx);
  }
  else {
    aio->a_sleep = false;
    nni_aio_expire_rm(aio);
    nni_mtx_unlock(&mtx->eq_mtx);
    nni_aio_finish_error(aio,rv);
  }
  return;
}

Assistant:

static void
nni_sleep_cancel(nng_aio *aio, void *arg, int rv)
{
	NNI_ARG_UNUSED(arg);
	nni_aio_expire_q *eq = aio->a_expire_q;

	nni_mtx_lock(&eq->eq_mtx);
	if (!aio->a_sleep) {
		nni_mtx_unlock(&eq->eq_mtx);
		return;
	}

	aio->a_sleep = false;
	nni_aio_expire_rm(aio);
	nni_mtx_unlock(&eq->eq_mtx);

	nni_aio_finish_error(aio, rv);
}